

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::PrintKeys(cmCursesMainForm *this,int process)

{
  FORM *form;
  bool bVar1;
  FIELD *field;
  long *plVar2;
  size_t sVar3;
  char *pcVar4;
  char *__src;
  int iVar5;
  char fmt_s [3];
  char firstLine [512];
  char fmt [512];
  char thirdLine [512];
  char secondLine [512];
  
  if (_stdscr == 0) {
    return;
  }
  if ((short)*(ushort *)(_stdscr + 6) < 0x40) {
    return;
  }
  iVar5 = (int)*(short *)(_stdscr + 4);
  if (*(short *)(_stdscr + 4) < 5 || (int)(*(ushort *)(_stdscr + 6) + 1) < this->InitialWidth) {
    return;
  }
  form = (this->super_cmCursesForm).Form;
  bVar1 = true;
  if (form != (FORM *)0x0) {
    field = current_field(form);
    plVar2 = (long *)field_userptr(field);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x30))(plVar2);
      bVar1 = false;
      goto LAB_00267a1b;
    }
  }
  plVar2 = (long *)0x0;
LAB_00267a1b:
  memset(firstLine,0,0x200);
  memset(secondLine,0,0x200);
  memset(thirdLine,0,0x200);
  if (process == 0) {
    if (this->OkToGenerate == true) {
      builtin_strncpy(firstLine + 0x30,"te and exit",0xc);
      builtin_strncpy(firstLine + 0x20,"ss [g] to genera",0x10);
      builtin_strncpy(firstLine + 0x18,"     Pre",8);
    }
    else {
      builtin_strncpy(firstLine + 0x30,"         ",10);
      builtin_strncpy(firstLine + 0x20,"                ",0x10);
      builtin_strncpy(firstLine + 0x18,"        ",8);
    }
    builtin_strncpy(firstLine,"Press [c] to configure  ",0x18);
    pcVar4 = "Off";
    if (this->AdvancedMode != false) {
      pcVar4 = "On";
    }
    sprintf(thirdLine,"Press [t] to toggle advanced mode (Currently %s)",pcVar4);
    __src = "Press [h] for help           Press [q] to quit without generating";
    pcVar4 = secondLine;
    sVar3 = 0x42;
  }
  else {
    sVar3 = 0x45;
    memcpy(firstLine,"                                                                    ",0x45);
    memcpy(secondLine,"                                                                    ",0x45);
    pcVar4 = thirdLine;
    __src = "                                                                    ";
  }
  memcpy(pcVar4,__src,sVar3);
  move(iVar5 + -3,0);
  fmt_s[2] = '\0';
  fmt_s[0] = '%';
  fmt_s[1] = 's';
  memcpy(fmt,"Press [enter] to edit option",0x200);
  if (process != 0) {
    builtin_strncpy(fmt + 0x14,"       ",8);
    builtin_strncpy(fmt,"                    ",0x14);
  }
  printw(fmt_s,fmt);
  move(iVar5 + -2,0);
  printw(fmt_s,firstLine);
  move(iVar5 + -1,0);
  printw(fmt_s,secondLine);
  move(iVar5,0);
  printw(fmt_s,thirdLine);
  if (!bVar1) {
    sprintf(firstLine,"Page %d of %d",(ulong)*(uint *)(plVar2 + 7),(ulong)(uint)this->NumberOfPages)
    ;
    sVar3 = strlen(firstLine);
    move(0,0x40 - (int)sVar3);
    printw(fmt_s,firstLine);
  }
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesMainForm::PrintKeys(int process /* = 0 */)
{
  int x,y;
  getmaxyx(stdscr, y, x);
  if ( x < cmCursesMainForm::MIN_WIDTH  ||
       x < this->InitialWidth               ||
       y < cmCursesMainForm::MIN_HEIGHT )
    {
    return;
    }

  // Give the current widget (if it exists), a chance to print keys
  cmCursesWidget* cw = 0;
  if (this->Form)
    {
    FIELD* currentField = current_field(this->Form);
    cw = reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
    }

  if (cw)
    {
    cw->PrintKeys();
    }

//    {
//    }
//  else
//    {
  char firstLine[512]="";
  char secondLine[512]="";
  char thirdLine[512]="";
  if (process)
    {
    const char* clearLine =
      "                                                                    ";
    strcpy(firstLine, clearLine);
    strcpy(secondLine, clearLine);
    strcpy(thirdLine, clearLine);
    }
  else
    {
    if (this->OkToGenerate)
      {
      sprintf(firstLine,
              "Press [c] to configure       Press [g] to generate and exit");
      }
    else
      {
      sprintf(firstLine,  "Press [c] to configure                                   ");
      }
    {
      const char* toggleKeyInstruction =
        "Press [t] to toggle advanced mode (Currently %s)";
      sprintf(thirdLine,
              toggleKeyInstruction,
              this->AdvancedMode ? "On" : "Off");
    }
    sprintf(secondLine,
            "Press [h] for help           "
            "Press [q] to quit without generating");
    }

  curses_move(y-4,0);
  char fmt_s[] = "%s";
  char fmt[512] = "Press [enter] to edit option";
  if ( process )
    {
    strcpy(fmt, "                           ");
    }
  printw(fmt_s, fmt);
  curses_move(y-3,0);
  printw(fmt_s, firstLine);
  curses_move(y-2,0);
  printw(fmt_s, secondLine);
  curses_move(y-1,0);
  printw(fmt_s, thirdLine);

  if (cw)
    {
    sprintf(firstLine, "Page %d of %d", cw->GetPage(), this->NumberOfPages);
    curses_move(0,65-static_cast<unsigned int>(strlen(firstLine))-1);
    printw(fmt_s, firstLine);
    }
//    }

  pos_form_cursor(this->Form);

}